

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O1

bool fast_float::long_mul<(unsigned_short)62>(stackvec<(unsigned_short)62> *x,limb_span y)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  ushort uVar11;
  bool bVar12;
  void *in_RAX;
  ulong *puVar13;
  ushort uVar14;
  ulong uVar15;
  ulong *puVar16;
  ulong uVar17;
  ulong uVar18;
  size_t in_R8;
  ulong uVar19;
  unsigned_long __n2;
  ulong uVar20;
  limb_span y_00;
  stackvec<(unsigned_short)62> zi;
  stackvec<(unsigned_short)62> z;
  stackvec<(unsigned_short)62> local_420;
  undefined1 local_228 [496];
  ushort local_38;
  
  uVar19 = y.length;
  puVar16 = y.ptr;
  uVar14 = x->length;
  uVar20 = (ulong)uVar14;
  local_38 = 0;
  if (uVar20 < 0x3f) {
    if (uVar20 != 0) {
      in_RAX = memcpy(local_228,x,(ulong)((uint)uVar14 * 8));
    }
    local_38 = local_38 + uVar14;
  }
  uVar11 = local_38;
  if (uVar19 != 0) {
    if (uVar20 == 0) {
      auVar7._8_8_ = 0;
      auVar7._0_8_ = in_RAX;
    }
    else {
      uVar1 = *puVar16;
      uVar17 = 0;
      uVar15 = 0;
      do {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = uVar15;
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar1;
        auVar4._8_8_ = 0;
        auVar4._0_8_ = x->data[uVar17];
        auVar7 = auVar2 * auVar4 + auVar8;
        uVar15 = auVar7._8_8_;
        x->data[uVar17] = auVar7._0_8_;
        uVar17 = uVar17 + 1;
      } while (uVar20 != uVar17);
    }
    if (auVar7._8_8_ != 0) {
      if (0x3d < uVar14) {
        return false;
      }
      x->data[uVar20] = auVar7._8_8_;
      x->length = uVar14 + 1;
    }
    if (uVar19 != 1) {
      uVar20 = 2;
      if (2 < uVar19) {
        uVar20 = uVar19;
      }
      uVar6 = (uint)local_38;
      uVar19 = 1;
      do {
        uVar1 = puVar16[uVar19];
        if (uVar1 != 0) {
          local_420.length = 0;
          if (0x3e < uVar11) {
            return false;
          }
          puVar13 = puVar16;
          if (uVar11 != 0) {
            puVar13 = (ulong *)memcpy(&local_420,local_228,(ulong)(uVar6 * 8));
          }
          uVar14 = local_420.length + uVar11;
          local_420.length = uVar14;
          if (0x3e < uVar11) {
            return false;
          }
          uVar15 = (ulong)uVar14;
          if (uVar15 == 0) {
            auVar9._8_8_ = 0;
            auVar9._0_8_ = puVar13;
          }
          else {
            uVar18 = 0;
            uVar17 = 0;
            do {
              auVar10._8_8_ = 0;
              auVar10._0_8_ = uVar17;
              auVar3._8_8_ = 0;
              auVar3._0_8_ = uVar1;
              auVar5._8_8_ = 0;
              auVar5._0_8_ = local_420.data[uVar18];
              auVar9 = auVar3 * auVar5 + auVar10;
              uVar17 = auVar9._8_8_;
              local_420.data[uVar18] = auVar9._0_8_;
              uVar18 = uVar18 + 1;
            } while (uVar15 != uVar18);
          }
          if (auVar9._8_8_ != 0) {
            if (0x3d < uVar14) {
              return false;
            }
            local_420.data[uVar15] = auVar9._8_8_;
            local_420.length = uVar14 + 1;
          }
          y_00.ptr = (unsigned_long *)(ulong)local_420.length;
          y_00.length = uVar19;
          bVar12 = large_add_from<(unsigned_short)62>((fast_float *)x,&local_420,y_00,in_R8);
          if (!bVar12) {
            return false;
          }
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 != uVar20);
    }
  }
  uVar14 = x->length;
  while ((uVar14 != 0 && (x->data[(ulong)uVar14 - 1] == 0))) {
    uVar14 = uVar14 - 1;
    x->length = uVar14;
  }
  return true;
}

Assistant:

FASTFLOAT_CONSTEXPR20
bool long_mul(stackvec<size>& x, limb_span y) noexcept {
  limb_span xs = limb_span(x.data, x.len());
  stackvec<size> z(xs);
  limb_span zs = limb_span(z.data, z.len());

  if (y.len() != 0) {
    limb y0 = y[0];
    FASTFLOAT_TRY(small_mul(x, y0));
    for (size_t index = 1; index < y.len(); index++) {
      limb yi = y[index];
      stackvec<size> zi;
      if (yi != 0) {
        // re-use the same buffer throughout
        zi.set_len(0);
        FASTFLOAT_TRY(zi.try_extend(zs));
        FASTFLOAT_TRY(small_mul(zi, yi));
        limb_span zis = limb_span(zi.data, zi.len());
        FASTFLOAT_TRY(large_add_from(x, zis, index));
      }
    }
  }

  x.normalize();
  return true;
}